

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.c
# Opt level: O0

void partial_op(float64 *p_op,float64 op,float64 **den,uint32 **den_idx,float32 **mixw,uint32 n_feat
               ,uint32 n_top)

{
  double local_50;
  float64 f_op;
  uint32 kk;
  uint32 k;
  uint32 j;
  uint32 n_top_local;
  uint32 n_feat_local;
  float32 **mixw_local;
  uint32 **den_idx_local;
  float64 **den_local;
  float64 op_local;
  float64 *p_op_local;
  
  for (kk = 0; kk < n_feat; kk = kk + 1) {
    local_50 = (double)(float)mixw[kk][*den_idx[kk]] * (double)*den[kk];
    for (f_op._4_4_ = 1; f_op._4_4_ < n_top; f_op._4_4_ = f_op._4_4_ + 1) {
      local_50 = (double)(float)mixw[kk][den_idx[kk][f_op._4_4_]] * (double)den[kk][f_op._4_4_] +
                 local_50;
    }
    p_op[kk] = (float64)((double)op / local_50);
  }
  return;
}

Assistant:

void
partial_op(float64 *p_op,
	   float64 op,

	   float64 **den,
	   uint32  **den_idx,
	   float32 **mixw,

	   uint32 n_feat,
	   uint32 n_top)
{
    uint32 j, k, kk;
    float64 f_op;

    for (j = 0; j < n_feat; j++) {	/* over all feature streams */

	/* Evaluate the mixture density for feature stream j
	 * gvn. component density values */
	k = den_idx[j][0];
	f_op = mixw[j][k] * den[j][0];
	for (kk = 1; kk < n_top; kk++) {
	    k = den_idx[j][kk];
	    f_op += mixw[j][k] * den[j][kk];
	}
	
	/* Figure out partial output probability excluding
	 * the given feature stream j. */
        /* That is technically correct but quite confusing, because
         * actually what we are trying to achieve here is a
         * normalization by f_op when we go to compute the mixture
         * posteriors.  See below. */
	p_op[j] = op / f_op;
    }
}